

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O3

void OPL3_ChannelSet4Op(opl3_chip *chip,uint8_t data)

{
  byte bVar1;
  undefined3 in_register_00000031;
  opl3_channel *channel;
  opl3_channel *channel_00;
  uint uVar3;
  ulong uVar2;
  
  uVar3 = 0;
  do {
    bVar1 = (byte)uVar3 + 6;
    if (uVar3 < 3) {
      bVar1 = (byte)uVar3;
    }
    uVar2 = (ulong)bVar1;
    channel = chip->channel + uVar2;
    if ((CONCAT31(in_register_00000031,data) >> (uVar3 & 0x1f) & 1) == 0) {
      channel->chtype = '\0';
      channel_00 = chip->channel + uVar2 + 3;
      chip->channel[uVar2 + 3].chtype = '\0';
      OPL3_ChannelUpdateAlg(channel);
    }
    else {
      channel->chtype = '\x01';
      chip->channel[uVar2 + 3].chtype = '\x02';
      channel_00 = channel;
    }
    OPL3_ChannelUpdateAlg(channel_00);
    uVar3 = uVar3 + 1;
  } while (uVar3 != 6);
  return;
}

Assistant:

INLINE void OPL3_ChannelSet4Op(opl3_chip *chip, uint8_t data)
{
    uint8_t bit;
    uint8_t chnum;
    for (bit = 0; bit < 6; bit++)
    {
        chnum = bit;
        if (bit >= 3)
        {
            chnum += 9 - 3;
        }
        if ((data >> bit) & 0x01)
        {
            chip->channel[chnum].chtype = ch_4op;
            chip->channel[chnum + 3u].chtype = ch_4op2;
            OPL3_ChannelUpdateAlg(&chip->channel[chnum]);
        }
        else
        {
            chip->channel[chnum].chtype = ch_2op;
            chip->channel[chnum + 3u].chtype = ch_2op;
            OPL3_ChannelUpdateAlg(&chip->channel[chnum]);
            OPL3_ChannelUpdateAlg(&chip->channel[chnum + 3u]);
        }
    }
}